

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::RepeatedEnumFieldGenerator::RepeatedEnumFieldGenerator
          (RepeatedEnumFieldGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  mapped_type *this_00;
  FieldDescriptor *in_RDX;
  RepeatedFieldGenerator *in_RSI;
  undefined8 *in_RDI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000278;
  FieldDescriptor *in_stack_00000280;
  allocator local_49;
  string local_48 [16];
  key_type *in_stack_ffffffffffffffc8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffd0;
  Options *in_stack_ffffffffffffffe0;
  
  RepeatedFieldGenerator::RepeatedFieldGenerator(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  *in_RDI = &PTR__RepeatedEnumFieldGenerator_008988a8;
  anon_unknown_4::SetEnumVariables(in_stack_00000280,in_stack_00000278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"array_storage_type",&local_49);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::operator=((string *)this_00,"GPBEnumArray");
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

RepeatedEnumFieldGenerator::RepeatedEnumFieldGenerator(
    const FieldDescriptor* descriptor, const Options& options)
    : RepeatedFieldGenerator(descriptor, options) {
  SetEnumVariables(descriptor, &variables_);
  variables_["array_storage_type"] = "GPBEnumArray";
}